

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void MD5Update(MD5Context *ctx,uchar *buf,uint len)

{
  uint uVar1;
  uint uVar2;
  void *__dest;
  uint in_EDX;
  void *in_RSI;
  uint32 *in_RDI;
  uchar *p;
  uint32 t;
  uint local_14;
  void *local_10;
  
  uVar2 = in_RDI[4];
  uVar1 = uVar2 + in_EDX * 8;
  in_RDI[4] = uVar1;
  if (uVar1 < uVar2) {
    in_RDI[5] = in_RDI[5] + 1;
  }
  in_RDI[5] = (in_EDX >> 0x1d) + in_RDI[5];
  uVar2 = uVar2 >> 3 & 0x3f;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (uVar2 != 0) {
    __dest = (void *)((long)in_RDI + (ulong)uVar2 + 0x18);
    uVar2 = 0x40 - uVar2;
    if (in_EDX < uVar2) {
      memcpy(__dest,in_RSI,(ulong)in_EDX);
      return;
    }
    memcpy(__dest,in_RSI,(ulong)uVar2);
    MD5Transform(in_RDI,in_RDI + 6);
    local_10 = (void *)((long)in_RSI + (ulong)uVar2);
    local_14 = in_EDX - uVar2;
  }
  for (; 0x3f < local_14; local_14 = local_14 - 0x40) {
    memcpy(in_RDI + 6,local_10,0x40);
    MD5Transform(in_RDI,in_RDI + 6);
    local_10 = (void *)((long)local_10 + 0x40);
  }
  memcpy(in_RDI + 6,local_10,(ulong)local_14);
  return;
}

Assistant:

void MD5Update(struct MD5Context *ctx, unsigned char *buf, unsigned int len)
{
  uint32 t;

  /* Update bitcount */

  t = ctx->bits[0];
  if ((ctx->bits[0] = t + ((uint32)len << 3)) < t)
    ctx->bits[1]++;             /* Carry from low to high */
  ctx->bits[1] += len >> 29;

  t = (t >> 3) & 0x3f;          /* Bytes already in shsInfo->data */

  /* Handle any leading odd-sized chunks */

  if (t) {
    unsigned char *p = (unsigned char *)ctx->in + t;

    t = 64 - t;
    if (len < t) {
      memcpy(p, buf, len);
      return;
    }
    memcpy(p, buf, t);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);
    buf += t;
    len -= t;
  }
  /* Process data in 64-byte chunks */

  while (len >= 64) {
    memcpy(ctx->in, buf, 64);
    byteReverse(ctx->in, 16);
    MD5Transform(ctx->buf, (uint32 *)ctx->in);
    buf += 64;
    len -= 64;
  }

  /* Handle any remaining bytes of data. */

  memcpy(ctx->in, buf, len);
}